

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalCommonGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalCommonGenerator::cmGlobalCommonGenerator(cmGlobalCommonGenerator *this,cmake *cm)

{
  _Rb_tree_header *p_Var1;
  
  cmGlobalGenerator::cmGlobalGenerator(&this->super_cmGlobalGenerator,cm);
  (this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator =
       (_func_int **)&PTR__cmGlobalCommonGenerator_00a0f3e8;
  p_Var1 = &(this->ClangTidyExportFixesDirs)._M_t._M_impl.super__Rb_tree_header;
  (this->ClangTidyExportFixesDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ClangTidyExportFixesDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ClangTidyExportFixesDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ClangTidyExportFixesDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ClangTidyExportFixesDirs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ClangTidyExportFixesFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->ClangTidyExportFixesFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ClangTidyExportFixesFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ClangTidyExportFixesFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ClangTidyExportFixesFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ClangTidyExportFixesFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

cmGlobalCommonGenerator::cmGlobalCommonGenerator(cmake* cm)
  : cmGlobalGenerator(cm)
{
}